

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m3x3.cpp
# Opt level: O3

void M3x3_RotateX(double (*input) [3],double degrees,double (*result) [3])

{
  int i;
  long lVar1;
  double *pdVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  int k;
  long lVar6;
  byte bVar7;
  double dVar8;
  double temp [3] [3];
  double local_b8 [10];
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  double local_28;
  
  bVar7 = 0;
  pdVar4 = &local_68;
  local_38 = IdentityMatrix[2][0];
  dStack_30 = IdentityMatrix[2][1];
  local_48 = IdentityMatrix[1][1];
  dStack_40 = IdentityMatrix[1][2];
  local_58 = IdentityMatrix[0][2];
  dStack_50 = IdentityMatrix[1][0];
  local_68 = IdentityMatrix[0][0];
  dStack_60 = IdentityMatrix[0][1];
  dVar8 = cos(degrees * 0.017453292519943295);
  dStack_30 = sin(degrees * 0.017453292519943295);
  local_48 = dVar8;
  dStack_40 = -dStack_30;
  local_28 = dVar8;
  lVar1 = 0;
  do {
    lVar3 = 0;
    pdVar2 = *input;
    do {
      dVar8 = 0.0;
      lVar6 = 0;
      pdVar5 = pdVar2;
      do {
        dVar8 = dVar8 + pdVar4[lVar6] * (*(double (*) [3])pdVar5)[0];
        lVar6 = lVar6 + 1;
        pdVar5 = (double *)((long)pdVar5 + 0x18);
      } while (lVar6 != 3);
      local_b8[lVar1 * 3 + lVar3] = dVar8;
      lVar3 = lVar3 + 1;
      pdVar2 = pdVar2 + 1;
    } while (lVar3 != 3);
    lVar1 = lVar1 + 1;
    pdVar4 = pdVar4 + 3;
  } while (lVar1 != 3);
  pdVar4 = local_b8;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    (*result)[0] = *pdVar4;
    pdVar4 = pdVar4 + (ulong)bVar7 * -2 + 1;
    result = (double (*) [3])((long)result + ((ulong)bVar7 * -2 + 1) * 8);
  }
  return;
}

Assistant:

void M3x3_RotateX(double input[3][3], double degrees, double result[3][3])
{
	double 	transformationmatrix[3][3];
  	double  sinvalue, cosvalue, radians;

    M3x3_LoadIdentity(transformationmatrix);

	radians = degrees * (M_PI/180.0);
	cosvalue = cos(radians);
	sinvalue = sin(radians);

	transformationmatrix[1][1] =  cosvalue;
	transformationmatrix[1][2] = -sinvalue;
	transformationmatrix[2][1] =  sinvalue;
	transformationmatrix[2][2] =  cosvalue;

	M3x3_MulMatrix(transformationmatrix, input, result);
}